

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<unsigned_int>
          (BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,CacheIdUnit *value)

{
  Type piVar1;
  Type pSVar2;
  hash_t hVar3;
  Type this_00;
  uint uVar4;
  uint depth;
  
  piVar1 = this->buckets;
  depth = 0;
  if (piVar1 != (Type)0x0) {
    hVar3 = PrimePolicy::ModPrime(*key & 0x7fffffff,this->bucketCount,this->modFunctionIndex);
    uVar4 = piVar1[hVar3];
    depth = 0;
    if (-1 < (int)uVar4) {
      depth = 0;
      do {
        if (this->entries[uVar4].
            super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
            super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.key ==
            *key) {
          this_00 = this->stats;
          goto LAB_008a8cdf;
        }
        depth = depth + 1;
        uVar4 = this->entries[uVar4].
                super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
                super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.next;
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = this->stats;
  uVar4 = 0xffffffff;
LAB_008a8cdf:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  if (-1 < (int)uVar4) {
    pSVar2 = this->entries;
    value->isRootObjectCache =
         pSVar2[uVar4].
         super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
         super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
         .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.value.
         isRootObjectCache;
    value->cacheId =
         pSVar2[uVar4].
         super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
         super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
         .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.value.
         cacheId;
  }
  return -1 < (int)uVar4;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }